

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall
duckdb::Value::SerializeInternal(Value *this,Serializer *serializer,bool serialize_type)

{
  PhysicalType PVar1;
  pointer __src;
  bool bVar2;
  string *psVar3;
  vector<duckdb::Value,_true> *children;
  NotImplementedException *this_00;
  InternalException *this_01;
  uint *puVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  string_t blob;
  string blob_str;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (((int)CONCAT71(in_register_00000011,serialize_type) != 0) ||
     (bVar2 = SerializationCompatibility::Compare
                        (&(serializer->options).serialization_compatibility,4), !bVar2)) {
    Serializer::WriteProperty<duckdb::LogicalType>(serializer,100,"type",&this->type_);
  }
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"is_null");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->is_null);
  (*serializer->_vptr_Serializer[3])(serializer);
  if (this->is_null != false) {
    return;
  }
  PVar1 = (this->type_).physical_type_;
  switch(PVar1) {
  case BOOL:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)(this->value_).utinyint);
    break;
  case UINT8:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0xf])(serializer,(ulong)(this->value_).utinyint);
    break;
  case INT8:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x10])(serializer,(ulong)(uint)(int)(this->value_).tinyint);
    break;
  case UINT16:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x11])(serializer,(ulong)(this->value_).usmallint);
    break;
  case INT16:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x12])(serializer,(ulong)(uint)(int)(this->value_).smallint);
    break;
  case UINT32:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x13])(serializer,(ulong)(this->value_).uinteger);
    break;
  case INT32:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x14])(serializer,(ulong)(this->value_).uinteger);
    break;
  case UINT64:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x15])(serializer,(this->value_).bigint);
    break;
  case INT64:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x16])(serializer,(this->value_).bigint);
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_01327106_caseD_a:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented type for Serialize","");
    NotImplementedException::NotImplementedException(this_00,(string *)&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x19])((ulong)(this->value_).uinteger,serializer);
    break;
  case DOUBLE:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x1a])((this->value_).bigint,serializer);
    break;
  case INTERVAL:
    Serializer::WriteProperty<duckdb::interval_t>(serializer,0x66,"value",&(this->value_).interval);
    return;
  case LIST:
    children = ListValue::GetChildren(this);
    goto LAB_0132720a;
  case STRUCT:
    children = StructValue::GetChildren(this);
    goto LAB_0132720a;
  case ARRAY:
    children = ArrayValue::GetChildren(this);
LAB_0132720a:
    SerializeChildren(serializer,children,&this->type_);
    return;
  default:
    puVar4 = &switchD_0132714c::switchdataD_01e194c8;
    switch(PVar1) {
    case VARCHAR:
      if ((this->type_).id_ == BLOB) {
        psVar3 = StringValue::Get_abi_cxx11_(this);
        __src = (psVar3->_M_dataplus)._M_p;
        uVar5 = (uint)psVar3->_M_string_length;
        if (uVar5 < 0xd) {
          uStack_44 = 0;
          uStack_4c = 0;
          uStack_48 = 0;
          if (uVar5 != 0) {
            switchD_012dd528::default(&uStack_4c,__src,(ulong)(uVar5 & 0xf));
          }
        }
        else {
          uStack_4c = *(undefined4 *)__src;
          uStack_48 = SUB84(__src,0);
          uStack_44 = (undefined4)((ulong)__src >> 0x20);
        }
        blob.value._4_1_ = (undefined1)uStack_44;
        blob.value._5_1_ = uStack_44._1_1_;
        blob.value._6_1_ = uStack_44._2_1_;
        blob.value._7_1_ = uStack_44._3_1_;
        blob.value.pointer.length = uStack_48;
        blob.value.pointer.ptr = (char *)puVar4;
        Blob::ToString_abi_cxx11_(&local_40,(Blob *)CONCAT44(uStack_4c,uVar5),blob);
        (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
        (*serializer->_vptr_Serializer[0x1c])(serializer,&local_40);
        (*serializer->_vptr_Serializer[3])(serializer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          return;
        }
        operator_delete(local_40._M_dataplus._M_p);
        return;
      }
      psVar3 = StringValue::Get_abi_cxx11_(this);
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x1c])(serializer,psVar3);
      break;
    default:
      goto switchD_01327106_caseD_a;
    case UINT128:
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x18])
                (serializer,(this->value_).bigint,(this->value_).hugeint.upper);
      break;
    case INT128:
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x17])
                (serializer,(this->value_).bigint,(this->value_).hugeint.upper);
      break;
    case BIT:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"BIT type should not be serialized","");
      InternalException::InternalException(this_01,(string *)&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void Value::SerializeInternal(Serializer &serializer, bool serialize_type) const {
	if (serialize_type || !serializer.ShouldSerialize(4)) {
		// only the root value needs to serialize its type
		// for forwards compatibility reasons, we also serialize the type always when targeting versions < v1.2.0
		serializer.WriteProperty(100, "type", type_);
	}
	serializer.WriteProperty(101, "is_null", is_null);
	if (IsNull()) {
		return;
	}
	switch (type_.InternalType()) {
	case PhysicalType::BIT:
		throw InternalException("BIT type should not be serialized");
	case PhysicalType::BOOL:
		serializer.WriteProperty(102, "value", value_.boolean);
		break;
	case PhysicalType::INT8:
		serializer.WriteProperty(102, "value", value_.tinyint);
		break;
	case PhysicalType::INT16:
		serializer.WriteProperty(102, "value", value_.smallint);
		break;
	case PhysicalType::INT32:
		serializer.WriteProperty(102, "value", value_.integer);
		break;
	case PhysicalType::INT64:
		serializer.WriteProperty(102, "value", value_.bigint);
		break;
	case PhysicalType::UINT8:
		serializer.WriteProperty(102, "value", value_.utinyint);
		break;
	case PhysicalType::UINT16:
		serializer.WriteProperty(102, "value", value_.usmallint);
		break;
	case PhysicalType::UINT32:
		serializer.WriteProperty(102, "value", value_.uinteger);
		break;
	case PhysicalType::UINT64:
		serializer.WriteProperty(102, "value", value_.ubigint);
		break;
	case PhysicalType::INT128:
		serializer.WriteProperty(102, "value", value_.hugeint);
		break;
	case PhysicalType::UINT128:
		serializer.WriteProperty(102, "value", value_.uhugeint);
		break;
	case PhysicalType::FLOAT:
		serializer.WriteProperty(102, "value", value_.float_);
		break;
	case PhysicalType::DOUBLE:
		serializer.WriteProperty(102, "value", value_.double_);
		break;
	case PhysicalType::INTERVAL:
		serializer.WriteProperty(102, "value", value_.interval);
		break;
	case PhysicalType::VARCHAR: {
		if (type_.id() == LogicalTypeId::BLOB) {
			auto blob_str = Blob::ToString(StringValue::Get(*this));
			serializer.WriteProperty(102, "value", blob_str);
		} else {
			serializer.WriteProperty(102, "value", StringValue::Get(*this));
		}
	} break;
	case PhysicalType::LIST:
		SerializeChildren(serializer, ListValue::GetChildren(*this), type_);
		break;
	case PhysicalType::STRUCT:
		SerializeChildren(serializer, StructValue::GetChildren(*this), type_);
		break;
	case PhysicalType::ARRAY:
		SerializeChildren(serializer, ArrayValue::GetChildren(*this), type_);
		break;
	default:
		throw NotImplementedException("Unimplemented type for Serialize");
	}
}